

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_PersonHandle.cpp
# Opt level: O0

PersonHandle * __thiscall
mbc::Val::PersonHandle::changeAttr(PersonHandle *this,string *attribute,string *value)

{
  Person *this_00;
  map<std::__cxx11::string,mbc::Val::Person*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,mbc::Val::Person*>>>
  *this_01;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  int iVar1;
  _ValAtom *this_03;
  Str *pSVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>
  local_78;
  string local_40;
  string *local_20;
  string *value_local;
  string *attribute_local;
  PersonHandle *this_local;
  
  if ((*(this->super_ValBase).is_vaild_ & 1U) != 0) {
    local_20 = value;
    value_local = attribute;
    attribute_local = (string *)this;
    remove(this,(char *)attribute);
    this_00 = this->person_;
    std::__cxx11::string::string((string *)&local_40,(string *)attribute);
    this_03 = Person::attr(this_00,&local_40);
    _ValAtom::set(this_03,value);
    std::__cxx11::string::~string((string *)&local_40);
    Person::update_ID_(this->person_);
    this_01 = (map<std::__cxx11::string,mbc::Val::Person*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,mbc::Val::Person*>>>
               *)this->mb_->persons_;
    pSVar2 = Person::ID(this->person_);
    iVar1 = (*(pSVar2->super__ValAtom).super_ValBase._vptr_ValBase[4])();
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>
    ::pair<mbc::Val::Person_*&,_true>
              (&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(extraout_var,iVar1),&this->person_);
    std::
    map<std::__cxx11::string,mbc::Val::Person*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,mbc::Val::Person*>>>
    ::insert<std::pair<std::__cxx11::string,mbc::Val::Person*>>(this_01,&local_78);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>
    ::~pair(&local_78);
    this_02 = this->mb_->order_;
    pSVar2 = Person::ID(this->person_);
    iVar1 = (*(pSVar2->super__ValAtom).super_ValBase._vptr_ValBase[4])();
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_02,(value_type *)CONCAT44(extraout_var_00,iVar1));
    *(this->super_ValBase).is_vaild_ = true;
    MessageBook::save(this->mb_);
    reset_(this);
  }
  return this;
}

Assistant:

PersonHandle& PersonHandle::changeAttr(string attribute, string value) {
    if(*is_vaild_) {
        // remove self and then update deeply
        remove();
        person_ -> attr(attribute) -> set(value);
        person_ -> update_ID_();

        // after the person's ID is changed, update mb.
        mb_ -> persons_ -> insert(std::pair<string, Person*>(person_ -> ID().raw(), person_));
        mb_ -> order_ -> push_back(person_ -> ID().raw());
        *is_vaild_ = true;

        // save messagebook and reset self
        mb_ -> save();
        reset_();
    } else {
        ; // do nothing
    }
    return *this;
}